

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_objref.cpp
# Opt level: O2

ON_Mesh * ON_MeshParent(ON_Geometry *geo)

{
  int iVar1;
  ON_Mesh *pOVar2;
  int extraout_var;
  ON_MeshComponentRef *this;
  
  if (geo != (ON_Geometry *)0x0) {
    iVar1 = (*(geo->super_ON_Object)._vptr_ON_Object[0xc])();
    if (iVar1 == 0x20) {
      pOVar2 = ON_Mesh::Cast(&geo->super_ON_Object);
      return pOVar2;
    }
    iVar1 = (*(geo->super_ON_Object)._vptr_ON_Object[0x22])(geo);
    if (-1 < extraout_var && iVar1 - 0xbU < 5) {
      this = ON_MeshComponentRef::Cast(&geo->super_ON_Object);
      if (this != (ON_MeshComponentRef *)0x0) {
        pOVar2 = ON_MeshComponentRef::Mesh(this);
        return pOVar2;
      }
    }
  }
  return (ON_Mesh *)0x0;
}

Assistant:

const ON_Mesh* ON_MeshParent( const ON_Geometry* geo )
{
  const ON_Mesh* mesh = 0;

  if ( geo == nullptr )
    return nullptr;

  if  ( ON::mesh_object == geo->ObjectType() )
  {
    mesh = ON_Mesh::Cast(geo);
  }
  else if ( geo->ComponentIndex().IsMeshComponentIndex() )
  {
    const ON_MeshComponentRef* cref = ON_MeshComponentRef::Cast(geo);
    if ( cref )
      mesh = cref->Mesh();
  }

  return mesh;
}